

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O1

int ndn_forwarder_put_data(uint8_t *data,size_t length)

{
  int iVar1;
  uint8_t *local_28;
  uint8_t *name;
  size_t name_len;
  
  if (data != (uint8_t *)0x0) {
    iVar1 = tlv_data_get_name(data,length,&local_28,(size_t *)&name);
    if (iVar1 == 0) {
      iVar1 = fwd_data_pipeline(data,length,local_28,(size_t)name,0xffff);
    }
    return iVar1;
  }
  return -0x10;
}

Assistant:

int
ndn_forwarder_put_data(uint8_t* data, size_t length)
{
  int ret;
  uint8_t *name;
  size_t name_len;

  if(data == NULL)
    return NDN_INVALID_POINTER;
  ret = tlv_data_get_name(data, length, &name, &name_len);
  if(ret != NDN_SUCCESS)
    return ret;

  return fwd_data_pipeline(data, length, name, name_len, NDN_INVALID_ID);
}